

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitRefTest
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,RefTest *curr)

{
  SmallVector<wasm::Literal,_1UL> *pSVar1;
  char cVar2;
  Flow *pFVar3;
  anon_union_16_6_1532cd5a_for_Literal_0 local_180;
  undefined8 local_170;
  SmallVector<wasm::Literal,_1UL> local_168;
  undefined8 local_130;
  undefined8 uStack_128;
  char local_120;
  SmallVector<wasm::Literal,_1UL> local_118;
  pointer local_e0;
  size_t sStack_d8;
  undefined1 local_d0 [8];
  Flow ref;
  Literal val;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_68;
  pointer local_50;
  size_t sStack_48;
  Literal local_40;
  
  visit((Flow *)local_d0,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_d0 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    wasm::Literal::Literal((Literal *)&ref.breakTo.super_IString.str._M_str,(Literal *)&ref);
    cVar2 = wasm::Type::isSubType
                      ((Type)val.field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(Type)*(uintptr_t *)(curr + 0x18));
    if (cVar2 == '\0') {
      wasm::Literal::Literal(&local_40,(Literal *)&ref.breakTo.super_IString.str._M_str);
      wasm::Literal::Literal((Literal *)&local_118,&local_40);
      cVar2 = '\x02';
      wasm::Literal::Literal((Literal *)&local_168,(Literal *)&local_118);
    }
    else {
      wasm::Literal::Literal(&local_40,(Literal *)&ref.breakTo.super_IString.str._M_str);
      wasm::Literal::Literal((Literal *)&local_118,&local_40);
      cVar2 = '\x01';
      wasm::Literal::Literal((Literal *)&local_168,(Literal *)&local_118);
    }
    local_120 = cVar2;
    wasm::Literal::~Literal((Literal *)&local_118);
    wasm::Literal::~Literal(&local_40);
    pSVar1 = (SmallVector<wasm::Literal,_1UL> *)&ref.breakTo;
  }
  else {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_118,(SmallVector<wasm::Literal,_1UL> *)local_d0);
    local_e0 = ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    sStack_d8 = ref.breakTo.super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str,&local_118);
    local_50 = local_e0;
    sStack_48 = sStack_d8;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_168,(SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
    local_130 = local_50;
    uStack_128 = sStack_48;
    local_120 = '\0';
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68);
    wasm::Literal::~Literal(&val);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_118.flexible);
    pSVar1 = &local_118;
  }
  wasm::Literal::~Literal((pSVar1->fixed)._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ref);
  if (local_120 == '\0') {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,&local_168);
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (undefined4)local_130;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) =
         local_130._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (undefined4)uStack_128;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) =
         uStack_128._4_4_;
  }
  else {
    local_180.i32 = (int32_t)(local_120 == '\x01');
    local_170 = 2;
    Flow::Flow(__return_storage_ptr__,(Literal *)&local_180.func);
    wasm::Literal::~Literal((Literal *)&local_180.func);
  }
  pFVar3 = (Flow *)(long)local_120;
  if (pFVar3 != (Flow *)0xffffffffffffffff) {
    pFVar3 = (Flow *)(*std::__detail::__variant::
                       __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>_&>
                       ::_S_vtable._M_arr[(long)pFVar3]._M_data)
                               ((anon_class_1_0_00000001 *)local_d0,
                                (variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                                 *)&local_168);
  }
  return pFVar3;
}

Assistant:

Flow visitRefTest(RefTest* curr) {
    NOTE_ENTER("RefTest");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else {
      return Literal(int32_t(bool(cast.getSuccess())));
    }
  }